

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

void nn_hash_rehash(nn_hash *self)

{
  nn_list *ptr;
  nn_list *pnVar1;
  int iVar2;
  nn_list *pnVar3;
  nn_list_item *item;
  nn_list_item *it;
  uint uVar4;
  uint uVar5;
  uint *in_RSI;
  uint *size;
  uint uVar6;
  ulong uVar7;
  
  uVar5 = self->slots;
  ptr = self->array;
  self->slots = uVar5 * 2;
  size = (uint *)((ulong)(uVar5 * 2) << 4);
  pnVar3 = (nn_list *)nn_alloc_((size_t)size);
  self->array = pnVar3;
  if (pnVar3 != (nn_list *)0x0) {
    if (self->slots != 0) {
      uVar7 = 0;
      do {
        nn_list_init(self->array + uVar7);
        uVar6 = (int)uVar7 + 1;
        uVar7 = (ulong)uVar6;
      } while (uVar6 != self->slots);
    }
    if ((ulong)uVar5 != 0) {
      uVar7 = 0;
      do {
        pnVar3 = ptr + uVar7;
        while( true ) {
          iVar2 = nn_list_empty(pnVar3);
          if (iVar2 != 0) break;
          nn_list_begin(pnVar3);
          item = nn_list_begin(pnVar3);
          nn_list_erase(pnVar3,item);
          uVar6 = (*(uint *)&item[-1].prev >> 0x10 ^ *(uint *)&item[-1].prev ^ 0x3d) * 9;
          uVar4 = (uVar6 >> 4 ^ uVar6) * 0x27d4eb2d;
          uVar6 = self->slots;
          pnVar1 = self->array;
          it = nn_list_end(pnVar1 + (ulong)(uVar4 >> 0xf ^ uVar4) % (ulong)uVar6);
          nn_list_insert(pnVar1 + (ulong)(uVar4 >> 0xf ^ uVar4) % (ulong)uVar6,item,it);
        }
        nn_list_term(pnVar3);
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar5);
    }
    nn_free(ptr);
    return;
  }
  nn_hash_rehash_cold_1();
  uVar5 = (*in_RSI >> 0x10 ^ *in_RSI ^ 0x3d) * 9;
  uVar5 = (uVar5 >> 4 ^ uVar5) * 0x27d4eb2d;
  nn_list_erase((nn_list *)
                (((ulong)(uVar5 >> 0xf ^ uVar5) % (ulong)*size) * 0x10 + *(long *)(size + 2)),
                (nn_list_item *)(in_RSI + 2));
  size[1] = size[1] - 1;
  return;
}

Assistant:

static void nn_hash_rehash (struct nn_hash *self) {
    uint32_t i;
    uint32_t oldslots;
    struct nn_list *oldarray;
    struct nn_hash_item *hitm;
    uint32_t newslot;

    /*  Allocate new double-sized array of slots. */
    oldslots = self->slots;
    oldarray = self->array;
    self->slots *= 2;
    self->array = nn_alloc (sizeof (struct nn_list) * self->slots, "hash map");
    alloc_assert (self->array);
    for (i = 0; i != self->slots; ++i)
    nn_list_init (&self->array [i]);

    /*  Move the items from old slot array to new slot array. */
    for (i = 0; i != oldslots; ++i) {
    while (!nn_list_empty (&oldarray [i])) {
        hitm = nn_cont (nn_list_begin (&oldarray [i]),
                struct nn_hash_item, list);
        nn_list_erase (&oldarray [i], &hitm->list);
        newslot = nn_hash_key (hitm->key) % self->slots;
        nn_list_insert (&self->array [newslot], &hitm->list,
                nn_list_end (&self->array [newslot]));
    }

    nn_list_term (&oldarray [i]);
    }

    /*  Deallocate the old array of slots. */
    nn_free (oldarray);
}